

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPartType.cpp
# Opt level: O3

bool Imf_2_5::isSupportedType(string *name)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __n = name->_M_string_length;
  if (__n == DAT_030d3240) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((name->_M_dataplus)._M_p,SCANLINEIMAGE_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == DAT_030d3260) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((name->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == DAT_030d3280) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((name->_M_dataplus)._M_p,DEEPSCANLINE_abi_cxx11_,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  if (__n == DAT_030d32a0) {
    if (__n == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp((name->_M_dataplus)._M_p,DEEPTILE_abi_cxx11_,__n);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isSupportedType(const string& name)
{
    return (name == SCANLINEIMAGE || name == TILEDIMAGE ||
            name == DEEPSCANLINE || name == DEEPTILE);
}